

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void parse_input_keymap(void)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  wchar_t *pwVar5;
  size_t sVar6;
  long lVar7;
  uint uVar8;
  uint code;
  allocator local_159;
  wstring local_158 [32];
  wchar_t line [32];
  wchar_t func_string [32];
  
  memset(char_keys,0,0xc4);
  memset(shift_keys,0,0xc4);
  memset(altgr_keys,0,0xc4);
  _stdin = freopen(args.keymap._M_dataplus._M_p,"r",_stdin);
  if (_stdin == (FILE *)0x0) {
    piVar4 = __errno_location();
    error(1,*piVar4,"Error opening input keymap \'%s\'",args.keymap._M_dataplus._M_p);
  }
  code = 0;
  uVar8 = 0;
  do {
    iVar2 = feof(_stdin);
    if ((iVar2 != 0) || (0x80 < code)) goto LAB_00106848;
    bVar1 = is_used_key(code);
    if (bVar1) {
      uVar8 = uVar8 + 1;
      pwVar5 = fgetws(line,0x80,_stdin);
      if (pwVar5 == (wchar_t *)0x0) {
        iVar2 = feof(_stdin);
        if (iVar2 != 0) {
LAB_00106848:
          fclose(_stdin);
          if (uVar8 < 0x6a) {
            error(1,0,"Too few lines in input keymap \'%s\'; There should be N_KEYS_DEFINED lines!",
                  args.keymap._M_dataplus._M_p);
          }
          return;
        }
        piVar4 = __errno_location();
        error_at_line(1,*piVar4,args.keymap._M_dataplus._M_p,uVar8,"fgets() error");
      }
      sVar6 = wcslen(line);
      if (8 < sVar6) {
        error_at_line(1,0,args.keymap._M_dataplus._M_p,uVar8,"Line too long!");
      }
      std::__cxx11::wstring::wstring(local_158,line,&local_159);
      lVar7 = std::__cxx11::wstring::find_last_not_of((wchar_t *)local_158,0x108bc0);
      std::__cxx11::wstring::~wstring(local_158);
      if (lVar7 == -1) {
        error_at_line(1,0,args.keymap._M_dataplus._M_p,uVar8,"No characters on line");
      }
      line[lVar7 + 1] = L'\0';
    }
    bVar1 = is_char_key(code);
    if (bVar1) {
      uVar3 = to_char_keys_index(code);
      iVar2 = __isoc99_swscanf(line,L"%lc %lc %lc",char_keys + uVar3,shift_keys + uVar3,
                               altgr_keys + uVar3);
      if (iVar2 < 1) {
        error_at_line(1,0,args.keymap._M_dataplus._M_p,uVar8,"Too few input characters on line");
      }
    }
    bVar1 = is_func_key(code);
    if (code != 0x39 && bVar1) {
      iVar2 = __isoc99_swscanf(line,L"%7ls",func_string);
      if (iVar2 != 1) {
        error_at_line(1,0,args.keymap._M_dataplus._M_p,uVar8,"Invalid function key string");
      }
      iVar2 = to_func_keys_index(code);
      wcscpy(func_keys[iVar2],func_string);
    }
    code = code + 1;
  } while( true );
}

Assistant:

void parse_input_keymap()
{
    // custom map will be used; erase existing US keytables
    memset(char_keys,  '\0', sizeof(char_keys));
    memset(shift_keys, '\0', sizeof(shift_keys));
    memset(altgr_keys, '\0', sizeof(altgr_keys));

    stdin = freopen(args.keymap.c_str(), "r", stdin);
    if (stdin == NULL)
        error(EXIT_FAILURE, errno, "Error opening input keymap '%s'", args.keymap.c_str());

    unsigned int i = -1;
    unsigned int line_number = 0;
    wchar_t func_string[32];
    wchar_t line[32];

    while (!feof(stdin)) {

        if (++i >= sizeof(char_or_func)) break;                         // only ever read up to 128 keycode bindings (currently N_KEYS_DEFINED are used)

        if (is_used_key(i)) {
            ++line_number;
            if(fgetws(line, sizeof(line), stdin) == NULL) {
                if (feof(stdin)) break;
                else error_at_line(EXIT_FAILURE, errno, args.keymap.c_str(), line_number, "fgets() error");
            }
            // line at most 8 characters wide (func lines are "1234567\n", char lines are "1 2 3\n")
            if (wcslen(line) > 8)                                     // TODO: replace 8*2 with 8 and wcslen()!
                error_at_line(EXIT_FAILURE, 0, args.keymap.c_str(), line_number, "Line too long!");
            // terminate line before any \r or \n
            std::wstring::size_type last = std::wstring(line).find_last_not_of(L"\r\n");
            if (last == std::wstring::npos)
                error_at_line(EXIT_FAILURE, 0, args.keymap.c_str(), line_number, "No characters on line");
            line[last + 1] = '\0';
        }

        if (is_char_key(i)) {
            unsigned int index = to_char_keys_index(i);
            if (swscanf(line, L"%lc %lc %lc", &char_keys[index], &shift_keys[index], &altgr_keys[index]) < 1) {
                error_at_line(EXIT_FAILURE, 0, args.keymap.c_str(), line_number, "Too few input characters on line");
            }
        }
        if (is_func_key(i)) {
            if (i == KEY_SPACE) continue;                                     // space causes empty string and trouble
            if (swscanf(line, L"%7ls", &func_string[0]) != 1)
                error_at_line(EXIT_FAILURE, 0, args.keymap.c_str(), line_number, "Invalid function key string");                                                 // does this ever happen?
            wcscpy(func_keys[to_func_keys_index(i)], func_string);
        }
    }             // while (!feof(stdin))
    fclose(stdin);

    if (line_number < N_KEYS_DEFINED)
#define QUOTE(x) #x  // quotes x so it can be used as (char*)
        error(EXIT_FAILURE, 0, "Too few lines in input keymap '%s'; There should be " QUOTE(N_KEYS_DEFINED) " lines!", args.keymap.c_str());
}